

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

int run_test(int inprocess)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_thread_t tid;
  uv_process_t process;
  
  if (inprocess == 0) {
    spawn_helper(&ctx.channel,&process,"ipc_send_recv_helper");
    connect_cb(&ctx.connect_req,0);
  }
  else {
    iVar1 = uv_thread_create(&tid,ipc_send_recv_helper_threadproc,(void *)0x2a);
    if (iVar1 != 0) {
      pcVar4 = "r == 0";
      uVar3 = 0xaf;
      goto LAB_00136965;
    }
    uv_sleep(1000);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&ctx.channel,1);
    if (iVar1 != 0) {
      pcVar4 = "r == 0";
      uVar3 = 0xb4;
      goto LAB_00136965;
    }
    uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    if (recv_cb_count == 2) {
      iVar1 = 0;
      if (inprocess != 0) {
        iVar1 = uv_thread_join(&tid);
        if (iVar1 != 0) {
          pcVar4 = "r == 0";
          uVar3 = 0xc4;
          goto LAB_00136965;
        }
      }
      return iVar1;
    }
    pcVar4 = "recv_cb_count == 2";
    uVar3 = 0xc0;
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0xbe;
  }
LAB_00136965:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

int run_test(const char* test,
             int benchmark_output,
             int test_count) {
  char errmsg[1024] = "";
  process_info_t processes[1024];
  process_info_t *main_proc;
  task_entry_t* task;
  int process_count;
  int result;
  int status;
  int i;

  status = 255;
  main_proc = NULL;
  process_count = 0;

#ifndef _WIN32
  /* Clean up stale socket from previous run. */
  remove(TEST_PIPENAME);
  remove(TEST_PIPENAME_2);
  remove(TEST_PIPENAME_3);
#endif

  /* If it's a helper the user asks for, start it directly. */
  for (task = TASKS; task->main; task++) {
    if (task->is_helper && strcmp(test, task->process_name) == 0) {
      return task->main();
    }
  }

  /* Start the helpers first. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    /* Skip the test itself. */
    if (!task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      1 /* is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    process_count++;
  }

  /* Now start the test itself. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    if (task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      0 /* !is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    main_proc = &processes[process_count];
    process_count++;
    break;
  }

  if (main_proc == NULL) {
    snprintf(errmsg,
             sizeof errmsg,
             "No test with that name: %s",
             test);
    goto out;
  }

  result = process_wait(main_proc, 1, task->timeout);
  if (result == -1) {
    FATAL("process_wait failed");
  } else if (result == -2) {
    /* Don't have to clean up the process, process_wait() has killed it. */
    snprintf(errmsg,
             sizeof errmsg,
             "timeout");
    goto out;
  }

  status = process_reap(main_proc);
  if (status != TEST_OK) {
    snprintf(errmsg,
             sizeof errmsg,
             "exit code %d",
             status);
    goto out;
  }

  if (benchmark_output) {
    /* Give the helpers time to clean up their act. */
    uv_sleep(1000);
  }

out:
  /* Reap running processes except the main process, it's already dead. */
  for (i = 0; i < process_count - 1; i++) {
    process_terminate(&processes[i]);
  }

  if (process_count > 0 &&
      process_wait(processes, process_count - 1, -1) < 0) {
    FATAL("process_wait failed");
  }

  log_tap_result(test_count, test, status, &processes[i]);

  /* Show error and output from processes if the test failed. */
  if ((status != TEST_OK && status != TEST_SKIP) || task->show_output) {
    if (strlen(errmsg) > 0)
      fprintf(stderr, "# %s\n", errmsg);
    fprintf(stderr, "# ");
    fflush(stderr);

    for (i = 0; i < process_count; i++) {
      switch (process_output_size(&processes[i])) {
       case -1:
        fprintf(stderr, "Output from process `%s`: (unavailable)\n",
                process_get_name(&processes[i]));
        fflush(stderr);
        break;

       case 0:
        fprintf(stderr, "Output from process `%s`: (no output)\n",
                process_get_name(&processes[i]));
        fflush(stderr);
        break;

       default:
        fprintf(stderr, "Output from process `%s`:\n", process_get_name(&processes[i]));
        fflush(stderr);
        process_copy_output(&processes[i], stderr);
        break;
      }
    }

  /* In benchmark mode show concise output from the main process. */
  } else if (benchmark_output) {
    switch (process_output_size(main_proc)) {
     case -1:
      fprintf(stderr, "%s: (unavailable)\n", test);
      fflush(stderr);
      break;

     case 0:
      fprintf(stderr, "%s: (no output)\n", test);
      fflush(stderr);
      break;

     default:
      for (i = 0; i < process_count; i++) {
        process_copy_output(&processes[i], stderr);
      }
      break;
    }
  }

  /* Clean up all process handles. */
  for (i = 0; i < process_count; i++) {
    process_cleanup(&processes[i]);
  }

  return status;
}